

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_main.c
# Opt level: O3

char * affinity_mask_str_r(cpu_affinity_mask_t *affinity_mask,char *buffer,uint32_t buffer_len)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ushort uVar4;
  ushort uVar5;
  bool bVar6;
  
  if (buffer_len < 2) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0x1fff;
    uVar5 = 0;
    bVar2 = 0;
    do {
      bVar6 = uVar4 < 4;
      bVar1 = affinity_mask->__bits[uVar4];
      if ((bool)(bVar1 != 0 | bVar6 | bVar2)) {
        snprintf(buffer + uVar5,3,"%02X",(ulong)bVar1);
        uVar5 = uVar5 + 2;
        if (uVar4 == 0) break;
      }
      uVar4 = uVar4 - 1;
      bVar2 = bVar1 != 0 | bVar6 | bVar2;
    } while (uVar5 + 1 < buffer_len);
    uVar3 = (ulong)uVar5;
  }
  buffer[uVar3] = '\0';
  return buffer;
}

Assistant:

char* affinity_mask_str_r(cpu_affinity_mask_t* affinity_mask, char* buffer, uint32_t buffer_len)
{
	logical_cpu_t mask_index = __MASK_SETSIZE - 1;
	logical_cpu_t str_index = 0;
	bool do_print = false;

	while (((uint32_t) str_index) + 1 < buffer_len) {
		if (do_print || (mask_index < 4) || (affinity_mask->__bits[mask_index] != 0x00)) {
			snprintf(&buffer[str_index], 3, "%02X", affinity_mask->__bits[mask_index]);
			do_print = true;
			str_index += 2;
		}
		/* mask_index in unsigned, so we cannot decrement it beyond 0 */
		if (mask_index == 0)
			break;
		mask_index--;
	}
	buffer[str_index] = '\0';

	return buffer;
}